

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O0

void __thiscall
simple_thread_pool::TaskHandle::TaskHandle
          (TaskHandle *this,ThreadPoolMgrBase *m,TaskHandler *h,uint64_t interval_us,TaskType tt)

{
  rep in_RCX;
  rep in_RSI;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RDI;
  undefined4 in_R8D;
  function<void_(const_simple_thread_pool::TaskResult_&)> *in_stack_ffffffffffffffc8;
  TaskHandle *in_stack_ffffffffffffffd0;
  
  *(undefined4 *)&(in_RDI->__d).__r = in_R8D;
  in_RDI[1].__d.__r = in_RSI;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(in_RDI);
  std::mutex::mutex((mutex *)0x11436d);
  in_RDI[8].__d.__r = in_RCX;
  std::function<void_(const_simple_thread_pool::TaskResult_&)>::function
            ((function<void_(const_simple_thread_pool::TaskResult_&)> *)in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8);
  std::atomic<simple_thread_pool::TaskStatus>::atomic
            ((atomic<simple_thread_pool::TaskStatus> *)(in_RDI + 0xd),WAITING);
  reschedule(in_stack_ffffffffffffffd0,(int64_t)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

TaskHandle(ThreadPoolMgrBase* m,
               const TaskHandler& h,
               uint64_t interval_us,
               TaskType tt)
        : type(tt)
        , mgr(m)
        , intervalUs(interval_us)
        , handler(h)
        , status(WAITING)
    {
        reschedule(intervalUs);
    }